

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::contains(ProString *this,char *s,CaseSensitivity cs)

{
  char *pcVar1;
  int iVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (s == (char *)0x0) {
    psVar3 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = s + 1 + (long)psVar3;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
  }
  QVar4.m_data = psVar3;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar4);
  local_68.d.d = (Data *)local_48;
  local_68.d.ptr = pcStack_40;
  local_68.d.size = local_38;
  iVar2 = indexOf(this,&local_68,0,cs);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return -1 < iVar2;
}

Assistant:

bool contains(const char *s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return indexOf(QLatin1String(s), 0, cs) >= 0; }